

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

void __thiscall cmFileInstaller::ManifestAppend(cmFileInstaller *this,string *file)

{
  string asStack_38 [32];
  
  if ((this->Manifest)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->Manifest);
  }
  std::__cxx11::string::substr((ulong)asStack_38,(ulong)file);
  std::__cxx11::string::append((string *)&this->Manifest);
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void cmFileInstaller::ManifestAppend(std::string const& file)
{
  if (!this->Manifest.empty()) {
    this->Manifest += ";";
  }
  this->Manifest += file.substr(this->DestDirLength);
}